

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  uint32_t *location;
  _func_int **pp_Var1;
  undefined8 uVar2;
  int iVar3;
  cb_explore *dat;
  _func_int ***__dest;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  base_learner *l;
  single_learner *base;
  single_learner *psVar6;
  learner<CB_EXPLORE::cb_explore,_example> *plVar7;
  code *predict;
  code *learn;
  size_t ws;
  ulong length;
  bool bVar8;
  size_type __dnew_6;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_5;
  _func_int ***local_a90;
  _func_int **local_a88;
  _func_int **local_a80 [2];
  size_t *local_a70;
  size_t *local_a68;
  uint32_t *local_a60;
  long local_a58;
  _func_int ***local_a50;
  _func_int **local_a48;
  _func_int **local_a40 [2];
  _func_int ***local_a30;
  _func_int **local_a28;
  _func_int **local_a20 [2];
  _func_int ***local_a10;
  _func_int **local_a08;
  _func_int **local_a00 [2];
  _func_int ***local_9f0;
  _func_int **local_9e8;
  _func_int **local_9e0 [2];
  _func_int ***local_9d0;
  _func_int **local_9c8;
  _func_int **local_9c0 [2];
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  option_group_definition local_910;
  long *local_8d8;
  long local_8d0;
  long local_8c8 [2];
  string local_8b8;
  undefined1 local_898 [112];
  bool local_828;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_810;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_800;
  undefined1 local_7f8 [112];
  bool local_788;
  ios_base local_778 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_770;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_760;
  typed_option<float> local_670;
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_int> local_d0;
  
  dat = calloc_or_throw<CB_EXPLORE::cb_explore>(1);
  memset(dat,0,0x138);
  local_7f8._0_8_ = (_func_int **)0x1d;
  local_a90 = local_a80;
  local_a90 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a90,(ulong)local_7f8);
  local_a80[0] = (_func_int **)local_7f8._0_8_;
  builtin_strncpy((char *)((long)local_a90 + 0xd),"ndit Exp",8);
  builtin_strncpy((char *)((long)local_a90 + 0x15),"loration",8);
  *(undefined4 *)local_a90 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_a90 + 4),"extu",4);
  *(undefined4 *)(local_a90 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_a90 + 0xc),"andi",4);
  local_a88 = (_func_int **)local_7f8._0_8_;
  *(char *)((long)local_a90 + local_7f8._0_8_) = '\0';
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_910,local_a90,(char *)(local_7f8._0_8_ + (long)local_a90));
  local_910.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_910.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_910.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a90 != local_a80) {
    operator_delete(local_a90);
  }
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  local_930.field_2._M_allocated_capacity = 0x6f6c7078655f6263;
  local_930.field_2._8_2_ = 0x6572;
  local_930._M_string_length = 10;
  local_930.field_2._M_local_buf[10] = '\0';
  location = &(dat->cbcs).num_actions;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_7f8,&local_930,location);
  local_788 = true;
  local_9d0 = local_9c0;
  local_898._0_8_ = (_func_int **)0x41;
  local_a60 = location;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_9d0,(ulong)local_898);
  uVar2 = local_898._0_8_;
  local_9c0[0] = (_func_int **)local_898._0_8_;
  local_9d0 = __dest;
  memcpy(__dest,"Online explore-exploit for a <k> action contextual bandit problem",0x41);
  local_9c8 = (_func_int **)uVar2;
  *(undefined1 *)((long)__dest + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_7f8 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_7f8);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(&local_910,&local_d0);
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  local_950.field_2._M_allocated_capacity._0_4_ = 0x73726966;
  local_950.field_2._M_allocated_capacity._4_2_ = 0x74;
  local_950._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_898,&local_950,&dat->tau);
  local_828 = true;
  local_9f0 = local_9e0;
  local_670.super_base_option._vptr_base_option = (_func_int **)0x15;
  local_9f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_9f0,(ulong)&local_670);
  local_9e0[0] = local_670.super_base_option._vptr_base_option;
  *local_9f0 = (_func_int **)0x737269662d756174;
  local_9f0[1] = (_func_int **)0x726f6c7078652074;
  builtin_strncpy((char *)((long)local_9f0 + 0xd),"loration",8);
  local_9e8 = local_670.super_base_option._vptr_base_option;
  *(char *)((long)local_9f0 + (long)local_670.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_898 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_170,(typed_option<unsigned_long> *)local_898);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_170);
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  local_970.field_2._M_allocated_capacity._0_4_ = 0x69737065;
  local_970.field_2._M_allocated_capacity._4_3_ = 0x6e6f6c;
  local_970._M_string_length = 7;
  local_970.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option(&local_670,&local_970,&dat->epsilon);
  local_670.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_670,0.05);
  local_a10 = local_a00;
  local_530._0_8_ = (_func_int **)0x1a;
  local_a10 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a10,(ulong)local_530);
  local_a00[0] = (_func_int **)local_530._0_8_;
  builtin_strncpy((char *)((long)local_a10 + 10),"eedy exp",8);
  builtin_strncpy((char *)((long)local_a10 + 0x12),"loration",8);
  *local_a10 = (_func_int **)0x2d6e6f6c69737065;
  local_a10[1] = (_func_int **)0x6520796465657267;
  local_a08 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_a10 + local_530._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_210);
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  local_990.field_2._M_allocated_capacity._0_4_ = 0x676162;
  local_990._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_530,&local_990,&dat->bag_size);
  local_4c0 = true;
  local_a30 = local_a20;
  local_5d0._0_8_ = (_func_int **)0x19;
  local_a30 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a30,(ulong)local_5d0);
  local_a20[0] = (_func_int **)local_5d0._0_8_;
  builtin_strncpy((char *)((long)local_a30 + 9),"ased exp",8);
  builtin_strncpy((char *)((long)local_a30 + 0x11),"loration",8);
  *local_a30 = (_func_int **)0x2d676e6967676162;
  local_a30[1] = (_func_int **)0x7865206465736162;
  local_a28 = (_func_int **)local_5d0._0_8_;
  *(char *)((long)local_a30 + local_5d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_530);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_2b0);
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  local_9b0.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_9b0.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_9b0._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_5d0,&local_9b0,&dat->cover_size);
  local_560 = true;
  local_a50 = local_a40;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_a50 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a50,(ulong)&local_490);
  local_a40[0] = local_490.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_a50 + 0xe),"ased exp",8);
  builtin_strncpy((char *)((long)local_a50 + 0x16),"loration",8);
  *local_a50 = (_func_int **)0x6320656e696c6e4f;
  local_a50[1] = (_func_int **)0x736162207265766f;
  local_a48 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_a50 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_350,(typed_option<unsigned_long> *)local_5d0);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_350);
  local_8b8.field_2._M_allocated_capacity._0_4_ = 0x697370;
  local_8b8._M_string_length = 3;
  local_a70 = &dat->bag_size;
  local_a68 = &dat->cover_size;
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  VW::config::typed_option<float>::typed_option(&local_490,&local_8b8,&dat->psi);
  local_490.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_490,1.0);
  local_a58 = 0x20;
  local_8d8 = local_8c8;
  local_8d8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_8d8,(ulong)&local_a58);
  local_8c8[0] = local_a58;
  local_8d8[2] = 0x6620726574656d61;
  local_8d8[3] = 0x7265766f6320726f;
  *local_8d8 = 0x6565726761736964;
  local_8d8[1] = 0x72617020746e656d;
  local_8d0 = local_a58;
  *(char *)((long)local_8d8 + local_a58) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar5);
  VW::config::option_group_definition::add<float>(poVar4,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_8d8 != local_8c8) {
    operator_delete(local_8d8);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_a50 != local_a40) {
    operator_delete(local_a50);
  }
  local_5d0._0_8_ = &PTR__typed_option_002d16b8;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_a30 != local_a20) {
    operator_delete(local_a30);
  }
  local_530._0_8_ = &PTR__typed_option_002d16b8;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_a10 != local_a00) {
    operator_delete(local_a10);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_9f0 != local_9e0) {
    operator_delete(local_9f0);
  }
  local_898._0_8_ = &PTR__typed_option_002d16b8;
  if (local_800._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_800._M_pi);
  }
  if (local_810._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_810._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_898);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1728;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_9d0 != local_9c0) {
    operator_delete(local_9d0);
  }
  local_7f8._0_8_ = &PTR__typed_option_002d1728;
  if (local_760._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_760._M_pi);
  }
  if (local_770._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_770._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_910);
  pp_Var1 = (_func_int **)(local_7f8 + 0x10);
  local_7f8._16_8_ = 0x6f6c7078655f6263;
  local_7f8._24_2_ = 0x6572;
  local_7f8._8_8_ = (pointer)0xa;
  local_7f8[0x1a] = '\0';
  local_7f8._0_8_ = pp_Var1;
  iVar3 = (*options->_vptr_options_i[1])(options,local_7f8);
  if ((_func_int **)local_7f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar7 = (learner<CB_EXPLORE::cb_explore,_example> *)0x0;
  }
  else {
    dat->all = all;
    length = (ulong)(dat->cbcs).num_actions;
    local_7f8._8_8_ = (pointer)0x2;
    local_7f8._16_3_ = 0x6263;
    local_7f8._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_7f8._0_8_ != pp_Var1) {
      operator_delete((void *)local_7f8._0_8_);
    }
    if ((char)iVar3 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_7f8);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_7f8 + 0x10));
      local_898._16_2_ = 0x6263;
      local_898._8_8_ = (pointer)0x2;
      local_898[0x12] = 0;
      local_898._0_8_ = local_898 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_898,&local_670);
      if (local_670.super_base_option._vptr_base_option !=
          (_func_int **)&local_670.super_base_option.m_name._M_string_length) {
        operator_delete(local_670.super_base_option._vptr_base_option);
      }
      if ((undefined1 *)local_898._0_8_ != local_898 + 0x10) {
        operator_delete((void *)local_898._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_7f8);
      std::ios_base::~ios_base(local_778);
    }
    all->delete_prediction = ACTION_SCORE::delete_action_scores;
    (dat->cbcs).cb_type = 0;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (dat->cbcs).scorer = all->scorer;
    local_7f8._16_6_ = 0x7265766f63;
    local_7f8._8_8_ = (pointer)0x5;
    local_7f8._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_7f8._0_8_ != pp_Var1) {
      operator_delete((void *)local_7f8._0_8_);
    }
    if ((char)iVar3 == '\0') {
      local_7f8._16_4_ = 0x676162;
      local_7f8._8_8_ = (pointer)0x3;
      local_7f8._0_8_ = pp_Var1;
      iVar3 = (*options->_vptr_options_i[1])(options);
      if ((_func_int **)local_7f8._0_8_ != pp_Var1) {
        operator_delete((void *)local_7f8._0_8_);
      }
      if ((char)iVar3 == '\0') {
        local_7f8._16_6_ = 0x7473726966;
        local_7f8._8_8_ = (pointer)0x5;
        local_7f8._0_8_ = pp_Var1;
        iVar3 = (*options->_vptr_options_i[1])(options);
        if ((_func_int **)local_7f8._0_8_ != pp_Var1) {
          operator_delete((void *)local_7f8._0_8_);
        }
        learn = CB_EXPLORE::predict_or_learn_greedy<true>;
        bVar8 = (char)iVar3 != '\0';
        if (bVar8) {
          learn = CB_EXPLORE::predict_or_learn_first<true>;
        }
        predict = CB_EXPLORE::predict_or_learn_greedy<false>;
        if (bVar8) {
          predict = CB_EXPLORE::predict_or_learn_first<false>;
        }
        ws = 1;
      }
      else {
        ws = *local_a70;
        predict = CB_EXPLORE::predict_or_learn_bag<false>;
        learn = CB_EXPLORE::predict_or_learn_bag<true>;
      }
    }
    else {
      psVar6 = LEARNER::as_singleline<char,char>(all->cost_sensitive);
      dat->cs = (learner<CB_EXPLORE::cb_explore,_example> *)psVar6;
      v_array<COST_SENSITIVE::wclass>::resize(&(dat->second_cs_label).costs,length);
      (dat->second_cs_label).costs._end = (dat->second_cs_label).costs._begin + length;
      (dat->cover_probs)._begin = (float *)0x0;
      (dat->cover_probs)._end = (float *)0x0;
      (dat->cover_probs).end_array = (float *)0x0;
      (dat->cover_probs).erase_count = 0;
      v_array<float>::resize(&dat->cover_probs,length);
      (dat->preds).end_array = (uint *)0x0;
      (dat->preds).erase_count = 0;
      (dat->preds)._begin = (uint *)0x0;
      (dat->preds)._end = (uint *)0x0;
      v_array<unsigned_int>::resize(&dat->preds,dat->cover_size);
      ws = *local_a68 + 1;
      predict = CB_EXPLORE::predict_or_learn_cover<false>;
      learn = CB_EXPLORE::predict_or_learn_cover<true>;
    }
    plVar7 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>(dat,base,learn,predict,ws,action_probs);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = CB_EXPLORE::finish;
    *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x68) = CB_EXPLORE::finish_example;
    dat = (cb_explore *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_910.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p);
  }
  if (dat != (cb_explore *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}